

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_sdf.cpp
# Opt level: O0

void sdf_tools::evaluateAtGridPoints(Sdf *sdf,Grid *grid)

{
  anon_class_8_1_ba1d7795 applySdf;
  Grid *in_stack_00000088;
  anon_class_8_1_ba1d7795 *in_stack_00000090;
  
  gridForEachPoint<sdf_tools::evaluateAtGridPoints(sdf_tools::sdf::Sdf_const*,sdf_tools::Grid*)::__0>
            (in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void evaluateAtGridPoints(const sdf::Sdf *sdf, Grid *grid)
{
    auto applySdf = [sdf](real3 r, real& gridValue) {gridValue = sdf->at(r);};
    gridForEachPoint(applySdf, grid);
}